

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_createmem(size_t msize,int *handle)

{
  char *pcVar1;
  long lVar2;
  size_t *psVar3;
  
  *handle = -1;
  psVar3 = &memTable[0].memsize;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 10000) {
      return 0x67;
    }
    if (((memdriver *)(psVar3 + -3))->memaddrptr == (char **)0x0) break;
    lVar2 = lVar2 + 1;
    psVar3 = psVar3 + 9;
  }
  *handle = (int)lVar2;
  ((memdriver *)(psVar3 + -3))->memaddrptr = (char **)(psVar3 + -2);
  psVar3[-1] = (size_t)psVar3;
  if (msize != 0) {
    pcVar1 = (char *)malloc(msize);
    psVar3[-2] = (size_t)pcVar1;
    if (pcVar1 == (char *)0x0) {
      ffpmsg("malloc of initial memory failed (mem_createmem)");
      return 0x68;
    }
  }
  *psVar3 = msize;
  psVar3[1] = 0xb40;
  psVar3[3] = 0;
  psVar3[4] = 0;
  psVar3[2] = (size_t)realloc;
  return 0;
}

Assistant:

int mem_createmem(size_t msize, int *handle)
/* 
  lowest level routine to allocate a memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    /* use the internally allocated memaddr and memsize variables */
    memTable[ii].memaddrptr = &memTable[ii].memaddr;
    memTable[ii].memsizeptr = &memTable[ii].memsize;

    /* allocate initial block of memory for the file */
    if (msize > 0)
    {
        memTable[ii].memaddr = (char *) malloc(msize); 
        if ( !(memTable[ii].memaddr) )
        {
            ffpmsg("malloc of initial memory failed (mem_createmem)");
            return(FILE_NOT_OPENED);
        }
    }

    /* set initial state of the file */
    memTable[ii].memsize = msize;
    memTable[ii].deltasize = 2880;
    memTable[ii].fitsfilesize = 0;
    memTable[ii].currentpos = 0;
    memTable[ii].mem_realloc = realloc;
    return(0);
}